

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O1

void Saig_BmcDeriveFailed(Saig_Bmc_t *p,int iTargetFail)

{
  int iVar1;
  int iVar2;
  
  p->iFrameFail = p->iFrameLast;
  p->iOutputFail = p->iOutputLast;
  iVar1 = p->vTargets->nSize;
  if (iTargetFail < iVar1) {
    iVar2 = p->iOutputFail;
    do {
      if (iVar2 == 0) {
        iVar2 = p->pAig->nTruePos;
        p->iFrameFail = p->iFrameFail + -1;
      }
      iVar2 = iVar2 + -1;
      iVar1 = iVar1 + -1;
    } while (iTargetFail < iVar1);
    p->iOutputFail = iVar2;
  }
  return;
}

Assistant:

void Saig_BmcDeriveFailed( Saig_Bmc_t * p, int iTargetFail )
{
    int k;
    p->iOutputFail = p->iOutputLast;
    p->iFrameFail  = p->iFrameLast;
    for ( k = Vec_PtrSize(p->vTargets); k > iTargetFail; k-- )
    {
        if ( p->iOutputFail == 0 )
        {
            p->iOutputFail = Saig_ManPoNum(p->pAig);
            p->iFrameFail--;
        }
        p->iOutputFail--;
    }
}